

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::EnumNumMethod::~EnumNumMethod(EnumNumMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

EnumNumMethod() : SystemSubroutine(KnownSystemName::Num, SubroutineKind::Function) {}